

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_Set_Transform(FT_Face face,FT_Matrix *matrix,FT_Vector *delta)

{
  FT_Face_Internal pFVar1;
  FT_Face_Internal internal;
  FT_Vector *delta_local;
  FT_Matrix *matrix_local;
  FT_Face face_local;
  
  if (face != (FT_Face)0x0) {
    pFVar1 = face->internal;
    pFVar1->transform_flags = 0;
    if (matrix == (FT_Matrix *)0x0) {
      (pFVar1->transform_matrix).xx = 0x10000;
      (pFVar1->transform_matrix).xy = 0;
      (pFVar1->transform_matrix).yx = 0;
      (pFVar1->transform_matrix).yy = 0x10000;
      delta_local = (FT_Vector *)pFVar1;
    }
    else {
      (pFVar1->transform_matrix).xx = matrix->xx;
      (pFVar1->transform_matrix).xy = matrix->xy;
      (pFVar1->transform_matrix).yx = matrix->yx;
      (pFVar1->transform_matrix).yy = matrix->yy;
      delta_local = (FT_Vector *)matrix;
    }
    if (((delta_local->y != 0 || delta_local[1].x != 0) || (delta_local->x != 0x10000)) ||
       (delta_local[1].y != 0x10000)) {
      pFVar1->transform_flags = pFVar1->transform_flags | 1;
    }
    if (delta == (FT_Vector *)0x0) {
      (pFVar1->transform_delta).x = 0;
      (pFVar1->transform_delta).y = 0;
      internal = (FT_Face_Internal)&pFVar1->transform_delta;
    }
    else {
      (pFVar1->transform_delta).x = delta->x;
      (pFVar1->transform_delta).y = delta->y;
      internal = (FT_Face_Internal)delta;
    }
    if ((internal->transform_matrix).xx != 0 || (internal->transform_matrix).xy != 0) {
      pFVar1->transform_flags = pFVar1->transform_flags | 2;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Set_Transform( FT_Face     face,
                    FT_Matrix*  matrix,
                    FT_Vector*  delta )
  {
    FT_Face_Internal  internal;


    if ( !face )
      return;

    internal = face->internal;

    internal->transform_flags = 0;

    if ( !matrix )
    {
      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      matrix = &internal->transform_matrix;
    }
    else
      internal->transform_matrix = *matrix;

    /* set transform_flags bit flag 0 if `matrix' isn't the identity */
    if ( ( matrix->xy | matrix->yx ) ||
         matrix->xx != 0x10000L      ||
         matrix->yy != 0x10000L      )
      internal->transform_flags |= 1;

    if ( !delta )
    {
      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      delta = &internal->transform_delta;
    }
    else
      internal->transform_delta = *delta;

    /* set transform_flags bit flag 1 if `delta' isn't the null vector */
    if ( delta->x | delta->y )
      internal->transform_flags |= 2;
  }